

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

uint * fetchTransformedBilinearARGB32PM<(TextureBlendType)4>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  uint *puVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uchar *puVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  unkuint9 Var64;
  undefined1 auVar65 [15];
  undefined1 auVar66 [13];
  undefined1 auVar67 [15];
  unkuint9 Var68;
  undefined1 auVar69 [15];
  undefined1 auVar70 [13];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [13];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [13];
  undefined1 auVar77 [15];
  undefined1 auVar78 [11];
  undefined1 auVar79 [13];
  undefined1 auVar80 [15];
  undefined1 auVar81 [11];
  undefined1 auVar82 [13];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  int iVar97;
  int iVar98;
  uint uVar99;
  long lVar100;
  uint *puVar101;
  uint *puVar102;
  uint uVar103;
  long lVar104;
  uint unaff_EBP;
  uint uVar105;
  long lVar106;
  int iVar107;
  uint uVar108;
  int iVar109;
  uint uVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  long in_FS_OFFSET;
  ulong uVar114;
  short sVar115;
  short sVar118;
  double dVar116;
  double dVar117;
  short sVar119;
  short sVar123;
  double dVar120;
  byte bVar124;
  undefined1 auVar121 [12];
  undefined1 auVar122 [16];
  double dVar125;
  ulong uVar126;
  byte bVar128;
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  double dVar132;
  undefined1 auVar133 [12];
  double dVar143;
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  double dVar144;
  undefined4 uVar145;
  double dVar146;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [12];
  int iVar155;
  undefined1 auVar156 [16];
  int fy;
  int fx;
  uint local_40;
  undefined4 local_3c;
  long local_38;
  undefined1 auVar135 [16];
  undefined1 auVar147 [12];
  undefined1 auVar148 [16];
  undefined1 auVar154 [16];
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dVar144 = (double)x + 0.5;
  dVar146 = (double)y + 0.5;
  puVar1 = buffer + length;
  if ((data->field_0x8a & 1) != 0) {
    dVar117 = data->m12;
    dVar132 = (dVar146 * data->m21 + dVar144 * data->m11 + data->dx) * 65536.0;
    dVar143 = (dVar146 * data->m22 + dVar144 * dVar117 + data->dy) * 65536.0;
    dVar120 = dVar143;
    if (dVar132 <= dVar143) {
      dVar120 = dVar132;
    }
    dVar116 = trunc(data->m11 * 65536.0);
    dVar117 = trunc(dVar117 * 65536.0);
    dVar125 = (double)length * dVar116 + dVar132;
    dVar116 = (double)length * dVar117 + dVar143;
    dVar117 = dVar116;
    if (dVar125 <= dVar116) {
      dVar117 = dVar125;
    }
    if (dVar120 <= dVar117) {
      dVar117 = dVar120;
    }
    if (-2147483648.0 <= dVar117) {
      if (dVar143 <= dVar132) {
        dVar143 = dVar132;
      }
      if (dVar116 <= dVar125) {
        dVar116 = dVar125;
      }
      if (dVar116 <= dVar143) {
        dVar116 = dVar143;
      }
      if (dVar116 <= 2147483647.0) {
        dVar117 = data->m11;
        uVar103 = (uint)(dVar117 * 65536.0);
        iVar97 = (int)(data->m12 * 65536.0);
        dVar143 = data->m22;
        local_3c = (int)((data->m21 * dVar146 + dVar144 * dVar117 + data->dx) * 65536.0) - 0x8000;
        local_40 = (int)((dVar146 * dVar143 + dVar144 * data->m12 + data->dy) * 65536.0) - 0x8000;
        if (iVar97 != 0) {
          uVar114 = -(ulong)(dVar117 < -dVar117);
          if (((double)(~uVar114 & (ulong)dVar117 | (ulong)-dVar117 & uVar114) < 0.125) ||
             (uVar114 = -(ulong)(dVar143 < -dVar143),
             (double)(~uVar114 & (ulong)dVar143 | (ulong)-dVar143 & uVar114) < 0.125)) {
            if (0 < length) {
              puVar6 = (data->field_23).texture.imageData;
              lVar106 = (data->field_23).texture.bytesPerLine;
              puVar102 = buffer;
              do {
                iVar113 = (int)local_3c >> 0x10;
                iVar111 = (int)local_40 >> 0x10;
                iVar109 = (data->field_23).texture.x2 + -1;
                iVar98 = iVar109;
                if (iVar113 < iVar109) {
                  iVar109 = iVar113;
                  iVar98 = iVar113 + 1;
                }
                iVar112 = (data->field_23).texture.x1;
                if (iVar113 < iVar112) {
                  iVar98 = iVar112;
                  iVar109 = iVar112;
                }
                iVar113 = (data->field_23).texture.y2 + -1;
                iVar112 = iVar113;
                if (iVar111 < iVar113) {
                  iVar113 = iVar111;
                  iVar112 = iVar111 + 1;
                }
                iVar155 = (data->field_23).texture.y1;
                if (iVar111 < iVar155) {
                  iVar112 = iVar155;
                  iVar113 = iVar155;
                }
                lVar104 = iVar113 * lVar106;
                uVar105 = *(uint *)(puVar6 + (long)iVar98 * 4 + lVar104);
                uVar145 = *(undefined4 *)(puVar6 + (long)iVar109 * 4 + lVar104);
                lVar104 = iVar112 * lVar106;
                uVar99 = *(uint *)(puVar6 + (long)iVar98 * 4 + lVar104);
                uVar3 = *(undefined4 *)(puVar6 + (long)iVar109 * 4 + lVar104);
                uVar108 = local_40 >> 8 & 0xff;
                uVar110 = local_3c >> 8 & 0xff;
                uVar114 = CONCAT44(uVar105,uVar145);
                uVar126 = CONCAT44(uVar99,uVar3);
                bVar128 = (byte)(uVar99 >> 0x18);
                auVar35._8_6_ = 0;
                auVar35._0_8_ = uVar126;
                auVar35[0xe] = bVar128;
                auVar39._8_4_ = 0;
                auVar39._0_8_ = uVar126;
                auVar39[0xc] = (char)(uVar99 >> 0x10);
                auVar39._13_2_ = auVar35._13_2_;
                auVar43._8_4_ = 0;
                auVar43._0_8_ = uVar126;
                auVar43._12_3_ = auVar39._12_3_;
                auVar47._8_2_ = 0;
                auVar47._0_8_ = uVar126;
                auVar47[10] = (char)(uVar99 >> 8);
                auVar47._11_4_ = auVar43._11_4_;
                auVar51._8_2_ = 0;
                auVar51._0_8_ = uVar126;
                auVar51._10_5_ = auVar47._10_5_;
                auVar55[8] = (char)uVar99;
                auVar55._0_8_ = uVar126;
                auVar55._9_6_ = auVar51._9_6_;
                auVar63._7_8_ = 0;
                auVar63._0_7_ = auVar55._8_7_;
                Var64 = CONCAT81(SUB158(auVar63 << 0x40,7),(char)((uint)uVar3 >> 0x18));
                auVar87._9_6_ = 0;
                auVar87._0_9_ = Var64;
                auVar59[4] = (char)((uint)uVar3 >> 0x10);
                auVar59._0_4_ = uVar3;
                auVar59._5_10_ = SUB1510(auVar87 << 0x30,5);
                auVar65._11_4_ = 0;
                auVar65._0_11_ = auVar59._4_11_;
                auVar66._1_12_ = SUB1512(auVar65 << 0x20,3);
                auVar66[0] = (char)((uint)uVar3 >> 8);
                bVar124 = (byte)(uVar105 >> 0x18);
                auVar36._8_6_ = 0;
                auVar36._0_8_ = uVar114;
                auVar36[0xe] = bVar124;
                auVar40._8_4_ = 0;
                auVar40._0_8_ = uVar114;
                auVar40[0xc] = (char)(uVar105 >> 0x10);
                auVar40._13_2_ = auVar36._13_2_;
                auVar44._8_4_ = 0;
                auVar44._0_8_ = uVar114;
                auVar44._12_3_ = auVar40._12_3_;
                auVar48._8_2_ = 0;
                auVar48._0_8_ = uVar114;
                auVar48[10] = (char)(uVar105 >> 8);
                auVar48._11_4_ = auVar44._11_4_;
                auVar52._8_2_ = 0;
                auVar52._0_8_ = uVar114;
                auVar52._10_5_ = auVar48._10_5_;
                auVar56[8] = (char)uVar105;
                auVar56._0_8_ = uVar114;
                auVar56._9_6_ = auVar52._9_6_;
                auVar67._7_8_ = 0;
                auVar67._0_7_ = auVar56._8_7_;
                Var68 = CONCAT81(SUB158(auVar67 << 0x40,7),(char)((uint)uVar145 >> 0x18));
                auVar88._9_6_ = 0;
                auVar88._0_9_ = Var68;
                auVar60[4] = (char)((uint)uVar145 >> 0x10);
                auVar60._0_4_ = uVar145;
                auVar60._5_10_ = SUB1510(auVar88 << 0x30,5);
                auVar69._11_4_ = 0;
                auVar69._0_11_ = auVar60._4_11_;
                auVar70._1_12_ = SUB1512(auVar69 << 0x20,3);
                auVar70[0] = (char)((uint)uVar145 >> 8);
                auVar129 = pshuflw(ZEXT416(uVar105),ZEXT416(0x100 - uVar108),0);
                auVar134 = pshuflw(ZEXT416(uVar99),ZEXT416(uVar108),0);
                sVar119 = auVar129._0_2_;
                sVar123 = auVar129._2_2_;
                sVar115 = auVar134._0_2_;
                sVar118 = auVar134._2_2_;
                auVar134._0_4_ =
                     CONCAT22(sVar118 * auVar66._0_2_ + sVar123 * auVar70._0_2_,
                              sVar115 * (ushort)(byte)uVar3 + sVar119 * (ushort)(byte)uVar145);
                auVar121._0_8_ =
                     CONCAT26(sVar118 * (short)Var64 + sVar123 * (short)Var68,
                              CONCAT24(sVar115 * auVar59._4_2_ + sVar119 * auVar60._4_2_,
                                       auVar134._0_4_));
                auVar121._8_2_ = sVar115 * auVar55._8_2_ + sVar119 * auVar56._8_2_;
                auVar121._10_2_ = sVar118 * auVar47._10_2_ + sVar123 * auVar48._10_2_;
                auVar129._12_2_ = sVar115 * auVar39._12_2_ + sVar119 * auVar40._12_2_;
                auVar129._0_12_ = auVar121;
                auVar129._14_2_ = sVar118 * (ushort)bVar128 + sVar123 * (ushort)bVar124;
                uVar145 = CONCAT22((short)uVar110,(short)(0x100 - uVar110));
                auVar134._12_4_ = auVar129._12_4_;
                auVar134._4_4_ = auVar121._8_4_;
                auVar134._8_4_ = (int)((ulong)auVar121._0_8_ >> 0x20);
                auVar129 = pshuflw(auVar134,auVar134,0xd8);
                auVar129 = pshufhw(auVar129,auVar129,0xd8);
                auVar127._4_4_ = uVar145;
                auVar127._0_4_ = uVar145;
                auVar127._8_4_ = uVar145;
                auVar127._12_4_ = uVar145;
                auVar137._0_2_ = auVar129._0_2_ >> 8;
                auVar137._2_2_ = auVar129._2_2_ >> 8;
                auVar137._4_2_ = auVar129._4_2_ >> 8;
                auVar137._6_2_ = auVar129._6_2_ >> 8;
                auVar137._8_2_ = auVar129._8_2_ >> 8;
                auVar137._10_2_ = auVar129._10_2_ >> 8;
                auVar137._12_2_ = auVar129._12_2_ >> 8;
                auVar137._14_2_ = auVar129._14_2_ >> 8;
                auVar129 = pmaddwd(auVar137,auVar127);
                auVar122._0_4_ = auVar129._0_4_ >> 8;
                auVar122._4_4_ = auVar129._4_4_ >> 8;
                auVar122._8_4_ = auVar129._8_4_ >> 8;
                auVar122._12_4_ = auVar129._12_4_ >> 8;
                auVar129 = packssdw(auVar122,auVar122);
                sVar115 = auVar129._0_2_;
                sVar118 = auVar129._2_2_;
                sVar119 = auVar129._4_2_;
                sVar123 = auVar129._6_2_;
                *puVar102 = CONCAT13((0 < sVar123) * (sVar123 < 0x100) * auVar129[6] -
                                     (0xff < sVar123),
                                     CONCAT12((0 < sVar119) * (sVar119 < 0x100) * auVar129[4] -
                                              (0xff < sVar119),
                                              CONCAT11((0 < sVar118) * (sVar118 < 0x100) *
                                                       auVar129[2] - (0xff < sVar118),
                                                       (0 < sVar115) * (sVar115 < 0x100) *
                                                       auVar129[0] - (0xff < sVar115))));
                local_3c = local_3c + uVar103;
                local_40 = local_40 + iVar97;
                puVar102 = puVar102 + 1;
              } while (puVar102 < puVar1);
            }
          }
          else {
            (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_4)
                      (buffer,puVar1,&data->field_23,&local_3c,&local_40,uVar103,iVar97);
          }
          goto LAB_00668dbb;
        }
        uVar105 = -uVar103;
        if (0 < (int)uVar103) {
          uVar105 = uVar103;
        }
        puVar102 = buffer;
        if (0x10000 < uVar105) {
          if (0x20000 < uVar105) {
            uVar114 = -(ulong)(dVar143 < -dVar143);
            if (0.125 <= (double)(~uVar114 & (ulong)dVar143 | (ulong)-dVar143 & uVar114)) {
              (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_2)
                        (buffer,puVar1,&data->field_23,&local_3c,&local_40,uVar103,0);
              goto LAB_00668dbb;
            }
            iVar98 = (int)local_40 >> 0x10;
            iVar97 = (data->field_23).texture.y2 + -1;
            iVar109 = iVar97;
            if (iVar98 < iVar97) {
              iVar97 = iVar98;
              iVar109 = iVar98 + 1;
            }
            iVar111 = (data->field_23).texture.y1;
            if (iVar98 < iVar111) {
              iVar97 = iVar111;
              iVar109 = iVar111;
            }
            puVar6 = (data->field_23).texture.imageData;
            lVar106 = (data->field_23).texture.bytesPerLine;
            lVar104 = iVar97 * lVar106;
            lVar106 = iVar109 * lVar106;
            uVar105 = local_40 >> 8 & 0xff;
            iVar97 = (data->field_23).texture.x1;
            iVar109 = (data->field_23).texture.x2;
            do {
              if (puVar1 <= puVar102) break;
              iVar112 = (int)local_3c._2_2_;
              iVar98 = (data->field_23).texture.x1;
              iVar113 = (data->field_23).texture.x2 + -1;
              iVar111 = iVar113;
              if (iVar112 < iVar113) {
                iVar113 = iVar112;
                iVar111 = iVar112 + 1;
              }
              if (iVar113 == iVar111 || iVar112 < iVar98) {
                iVar155 = iVar113;
                if (iVar112 < iVar98) {
                  iVar155 = iVar98;
                }
                uVar114 = (((ulong)*(uint *)(puVar6 + (long)iVar155 * 4 + lVar106) << 0x18 |
                           (ulong)*(uint *)(puVar6 + (long)iVar155 * 4 + lVar106)) &
                          0xff00ff00ff00ff) * (ulong)uVar105 +
                          (((ulong)*(uint *)(puVar6 + (long)iVar155 * 4 + lVar104) << 0x18 |
                           (ulong)*(uint *)(puVar6 + (long)iVar155 * 4 + lVar104)) &
                          0xff00ff00ff00ff) * (ulong)(0x100 - uVar105) >> 8 & 0xff00ff00ff00ff;
                *puVar102 = (uint)(uVar114 >> 0x18) | (uint)uVar114;
                local_3c = local_3c + uVar103;
                puVar102 = puVar102 + 1;
              }
            } while (iVar113 == iVar111 || iVar112 < iVar98);
            if ((int)uVar103 < 1) {
              puVar101 = puVar1;
              if ((int)uVar103 < 0) {
                lVar100 = (long)iVar97 * 0x10000 - (long)(int)local_3c;
                uVar114 = (ulong)(int)uVar103;
                goto LAB_00668bc1;
              }
            }
            else {
              lVar100 = ((long)iVar109 * 0x10000 + -0x10000) - (long)(int)local_3c;
              uVar114 = (ulong)uVar103;
LAB_00668bc1:
              puVar101 = puVar102 + lVar100 / (long)uVar114;
              if (puVar1 < puVar102 + lVar100 / (long)uVar114) {
                puVar101 = puVar1;
              }
            }
            if (puVar102 < puVar101) {
              auVar129 = pshuflw(ZEXT416(0x100 - uVar105),ZEXT416(0x100 - uVar105),0);
              auVar134 = pshuflw(ZEXT416(uVar105),ZEXT416(uVar105),0);
              do {
                uVar99 = local_3c >> 8 & 0xff;
                uVar114 = *(ulong *)(puVar6 + (long)((int)local_3c >> 0x10) * 4 + lVar104);
                uVar126 = *(ulong *)(puVar6 + (long)((int)local_3c >> 0x10) * 4 + lVar106);
                auVar9._8_6_ = 0;
                auVar9._0_8_ = uVar114;
                auVar9[0xe] = (char)(uVar114 >> 0x38);
                auVar13._8_4_ = 0;
                auVar13._0_8_ = uVar114;
                auVar13[0xc] = (char)(uVar114 >> 0x30);
                auVar13._13_2_ = auVar9._13_2_;
                auVar17._8_4_ = 0;
                auVar17._0_8_ = uVar114;
                auVar17._12_3_ = auVar13._12_3_;
                auVar21._8_2_ = 0;
                auVar21._0_8_ = uVar114;
                auVar21[10] = (char)(uVar114 >> 0x28);
                auVar21._11_4_ = auVar17._11_4_;
                auVar25._8_2_ = 0;
                auVar25._0_8_ = uVar114;
                auVar25._10_5_ = auVar21._10_5_;
                auVar29[8] = (char)(uVar114 >> 0x20);
                auVar29._0_8_ = uVar114;
                auVar29._9_6_ = auVar25._9_6_;
                auVar77._7_8_ = 0;
                auVar77._0_7_ = auVar29._8_7_;
                Var64 = CONCAT81(SUB158(auVar77 << 0x40,7),(char)(uVar114 >> 0x18));
                auVar91._9_6_ = 0;
                auVar91._0_9_ = Var64;
                auVar78._1_10_ = SUB1510(auVar91 << 0x30,5);
                auVar78[0] = (char)(uVar114 >> 0x10);
                auVar92._11_4_ = 0;
                auVar92._0_11_ = auVar78;
                auVar79._1_12_ = SUB1512(auVar92 << 0x20,3);
                auVar79[0] = (char)(uVar114 >> 8);
                sVar115 = auVar129._0_2_;
                sVar118 = auVar129._2_2_;
                auVar10._8_6_ = 0;
                auVar10._0_8_ = uVar126;
                auVar10[0xe] = (char)(uVar126 >> 0x38);
                auVar14._8_4_ = 0;
                auVar14._0_8_ = uVar126;
                auVar14[0xc] = (char)(uVar126 >> 0x30);
                auVar14._13_2_ = auVar10._13_2_;
                auVar18._8_4_ = 0;
                auVar18._0_8_ = uVar126;
                auVar18._12_3_ = auVar14._12_3_;
                auVar22._8_2_ = 0;
                auVar22._0_8_ = uVar126;
                auVar22[10] = (char)(uVar126 >> 0x28);
                auVar22._11_4_ = auVar18._11_4_;
                auVar26._8_2_ = 0;
                auVar26._0_8_ = uVar126;
                auVar26._10_5_ = auVar22._10_5_;
                auVar30[8] = (char)(uVar126 >> 0x20);
                auVar30._0_8_ = uVar126;
                auVar30._9_6_ = auVar26._9_6_;
                auVar80._7_8_ = 0;
                auVar80._0_7_ = auVar30._8_7_;
                Var68 = CONCAT81(SUB158(auVar80 << 0x40,7),(char)(uVar126 >> 0x18));
                auVar93._9_6_ = 0;
                auVar93._0_9_ = Var68;
                auVar81._1_10_ = SUB1510(auVar93 << 0x30,5);
                auVar81[0] = (char)(uVar126 >> 0x10);
                auVar94._11_4_ = 0;
                auVar94._0_11_ = auVar81;
                auVar82._1_12_ = SUB1512(auVar94 << 0x20,3);
                auVar82[0] = (char)(uVar126 >> 8);
                sVar119 = auVar134._0_2_;
                sVar123 = auVar134._2_2_;
                auVar136._0_4_ =
                     CONCAT22(auVar82._0_2_ * sVar123 + auVar79._0_2_ * sVar118,
                              (ushort)(byte)uVar126 * sVar119 + (ushort)(byte)uVar114 * sVar115);
                auVar133._0_8_ =
                     CONCAT26((short)Var68 * sVar123 + (short)Var64 * sVar118,
                              CONCAT24(auVar81._0_2_ * sVar119 + auVar78._0_2_ * sVar115,
                                       auVar136._0_4_));
                auVar133._8_2_ = auVar30._8_2_ * sVar119 + auVar29._8_2_ * sVar115;
                auVar133._10_2_ = auVar22._10_2_ * sVar123 + auVar21._10_2_ * sVar118;
                auVar135._12_2_ = auVar14._12_2_ * sVar119 + auVar13._12_2_ * sVar115;
                auVar135._0_12_ = auVar133;
                auVar135._14_2_ = (auVar10._13_2_ >> 8) * sVar123 + (auVar9._13_2_ >> 8) * sVar118;
                auVar130._0_4_ = CONCAT22((short)uVar99,(short)(0x100 - uVar99));
                auVar130._4_4_ = auVar130._0_4_;
                auVar130._8_4_ = auVar130._0_4_;
                auVar130._12_4_ = auVar130._0_4_;
                auVar136._12_4_ = auVar135._12_4_;
                auVar136._4_4_ = auVar133._8_4_;
                auVar136._8_4_ = (int)((ulong)auVar133._0_8_ >> 0x20);
                auVar137 = pshuflw(auVar136,auVar136,0xd8);
                auVar137 = pshufhw(auVar137,auVar137,0xd8);
                auVar138._0_2_ = auVar137._0_2_ >> 8;
                auVar138._2_2_ = auVar137._2_2_ >> 8;
                auVar138._4_2_ = auVar137._4_2_ >> 8;
                auVar138._6_2_ = auVar137._6_2_ >> 8;
                auVar138._8_2_ = auVar137._8_2_ >> 8;
                auVar138._10_2_ = auVar137._10_2_ >> 8;
                auVar138._12_2_ = auVar137._12_2_ >> 8;
                auVar138._14_2_ = auVar137._14_2_ >> 8;
                auVar137 = pmaddwd(auVar138,auVar130);
                auVar139._0_4_ = auVar137._0_4_ >> 8;
                auVar139._4_4_ = auVar137._4_4_ >> 8;
                auVar139._8_4_ = auVar137._8_4_ >> 8;
                auVar139._12_4_ = auVar137._12_4_ >> 8;
                auVar137 = packssdw(auVar139,auVar139);
                sVar115 = auVar137._0_2_;
                sVar118 = auVar137._2_2_;
                sVar119 = auVar137._4_2_;
                sVar123 = auVar137._6_2_;
                *puVar102 = CONCAT13((0 < sVar123) * (sVar123 < 0x100) * auVar137[6] -
                                     (0xff < sVar123),
                                     CONCAT12((0 < sVar119) * (sVar119 < 0x100) * auVar137[4] -
                                              (0xff < sVar119),
                                              CONCAT11((0 < sVar118) * (sVar118 < 0x100) *
                                                       auVar137[2] - (0xff < sVar118),
                                                       (0 < sVar115) * (sVar115 < 0x100) *
                                                       auVar137[0] - (0xff < sVar115))));
                local_3c = local_3c + uVar103;
                puVar102 = puVar102 + 1;
              } while (puVar102 < puVar101);
            }
            if (puVar102 < puVar1) {
              auVar129 = pshuflw(ZEXT416(0x100 - uVar105),ZEXT416(0x100 - uVar105),0);
              auVar134 = pshuflw(ZEXT416(uVar105),ZEXT416(uVar105),0);
              do {
                iVar97 = (data->field_23).texture.x1;
                iVar109 = (data->field_23).texture.x2 + -1;
                iVar111 = (int)local_3c >> 0x10;
                iVar98 = iVar109;
                if (iVar111 < iVar109) {
                  iVar109 = iVar111;
                  iVar98 = iVar111 + 1;
                }
                if (iVar111 < iVar97) {
                  iVar109 = iVar97;
                  iVar98 = iVar97;
                }
                uVar105 = local_3c >> 8 & 0xff;
                uVar145 = *(undefined4 *)(puVar6 + (long)iVar98 * 4 + lVar104);
                uVar3 = *(undefined4 *)(puVar6 + (long)iVar109 * 4 + lVar104);
                uVar4 = *(undefined4 *)(puVar6 + (long)iVar98 * 4 + lVar106);
                uVar5 = *(undefined4 *)(puVar6 + (long)iVar109 * 4 + lVar106);
                uVar114 = CONCAT44(uVar145,uVar3);
                uVar126 = CONCAT44(uVar4,uVar5);
                auVar7._8_6_ = 0;
                auVar7._0_8_ = uVar114;
                auVar7[0xe] = (char)((uint)uVar145 >> 0x18);
                auVar11._8_4_ = 0;
                auVar11._0_8_ = uVar114;
                auVar11[0xc] = (char)((uint)uVar145 >> 0x10);
                auVar11._13_2_ = auVar7._13_2_;
                auVar15._8_4_ = 0;
                auVar15._0_8_ = uVar114;
                auVar15._12_3_ = auVar11._12_3_;
                auVar19._8_2_ = 0;
                auVar19._0_8_ = uVar114;
                auVar19[10] = (char)((uint)uVar145 >> 8);
                auVar19._11_4_ = auVar15._11_4_;
                auVar23._8_2_ = 0;
                auVar23._0_8_ = uVar114;
                auVar23._10_5_ = auVar19._10_5_;
                auVar27[8] = (char)uVar145;
                auVar27._0_8_ = uVar114;
                auVar27._9_6_ = auVar23._9_6_;
                auVar83._7_8_ = 0;
                auVar83._0_7_ = auVar27._8_7_;
                Var64 = CONCAT81(SUB158(auVar83 << 0x40,7),(char)((uint)uVar3 >> 0x18));
                auVar95._9_6_ = 0;
                auVar95._0_9_ = Var64;
                auVar31[4] = (char)((uint)uVar3 >> 0x10);
                auVar31._0_4_ = uVar3;
                auVar31._5_10_ = SUB1510(auVar95 << 0x30,5);
                auVar84._11_4_ = 0;
                auVar84._0_11_ = auVar31._4_11_;
                auVar33[2] = (char)((uint)uVar3 >> 8);
                auVar33._0_2_ = (ushort)uVar3;
                auVar33._3_12_ = SUB1512(auVar84 << 0x20,3);
                auVar8._8_6_ = 0;
                auVar8._0_8_ = uVar126;
                auVar8[0xe] = (char)((uint)uVar4 >> 0x18);
                auVar12._8_4_ = 0;
                auVar12._0_8_ = uVar126;
                auVar12[0xc] = (char)((uint)uVar4 >> 0x10);
                auVar12._13_2_ = auVar8._13_2_;
                auVar16._8_4_ = 0;
                auVar16._0_8_ = uVar126;
                auVar16._12_3_ = auVar12._12_3_;
                auVar20._8_2_ = 0;
                auVar20._0_8_ = uVar126;
                auVar20[10] = (char)((uint)uVar4 >> 8);
                auVar20._11_4_ = auVar16._11_4_;
                auVar24._8_2_ = 0;
                auVar24._0_8_ = uVar126;
                auVar24._10_5_ = auVar20._10_5_;
                auVar28[8] = (char)uVar4;
                auVar28._0_8_ = uVar126;
                auVar28._9_6_ = auVar24._9_6_;
                auVar85._7_8_ = 0;
                auVar85._0_7_ = auVar28._8_7_;
                Var68 = CONCAT81(SUB158(auVar85 << 0x40,7),(char)((uint)uVar5 >> 0x18));
                auVar96._9_6_ = 0;
                auVar96._0_9_ = Var68;
                auVar32[4] = (char)((uint)uVar5 >> 0x10);
                auVar32._0_4_ = uVar5;
                auVar32._5_10_ = SUB1510(auVar96 << 0x30,5);
                auVar86._11_4_ = 0;
                auVar86._0_11_ = auVar32._4_11_;
                auVar34[2] = (char)((uint)uVar5 >> 8);
                auVar34._0_2_ = (ushort)uVar5;
                auVar34._3_12_ = SUB1512(auVar86 << 0x20,3);
                sVar115 = auVar129._0_2_;
                sVar118 = auVar129._2_2_;
                sVar119 = auVar134._0_2_;
                sVar123 = auVar134._2_2_;
                uVar145 = CONCAT22(auVar34._2_2_ * sVar123 + auVar33._2_2_ * sVar118,
                                   ((ushort)uVar5 & 0xff) * sVar119 +
                                   ((ushort)uVar3 & 0xff) * sVar115);
                auVar147._0_8_ =
                     CONCAT26((short)Var68 * sVar123 + (short)Var64 * sVar118,
                              CONCAT24(auVar32._4_2_ * sVar119 + auVar31._4_2_ * sVar115,uVar145));
                auVar147._8_2_ = auVar28._8_2_ * sVar119 + auVar27._8_2_ * sVar115;
                auVar147._10_2_ = auVar20._10_2_ * sVar123 + auVar19._10_2_ * sVar118;
                auVar148._12_2_ = auVar12._12_2_ * sVar119 + auVar11._12_2_ * sVar115;
                auVar148._0_12_ = auVar147;
                auVar148._14_2_ = (auVar8._13_2_ >> 8) * sVar123 + (auVar7._13_2_ >> 8) * sVar118;
                auVar131._0_4_ = CONCAT22((short)uVar105,(short)(0x100 - uVar105));
                auVar131._4_4_ = auVar131._0_4_;
                auVar131._8_4_ = auVar131._0_4_;
                auVar131._12_4_ = auVar131._0_4_;
                auVar140._4_4_ = auVar147._8_4_;
                auVar140._0_4_ = uVar145;
                auVar140._8_4_ = (int)((ulong)auVar147._0_8_ >> 0x20);
                auVar140._12_4_ = auVar148._12_4_;
                auVar137 = pshuflw(auVar140,auVar140,0xd8);
                auVar137 = pshufhw(auVar137,auVar137,0xd8);
                auVar141._0_2_ = auVar137._0_2_ >> 8;
                auVar141._2_2_ = auVar137._2_2_ >> 8;
                auVar141._4_2_ = auVar137._4_2_ >> 8;
                auVar141._6_2_ = auVar137._6_2_ >> 8;
                auVar141._8_2_ = auVar137._8_2_ >> 8;
                auVar141._10_2_ = auVar137._10_2_ >> 8;
                auVar141._12_2_ = auVar137._12_2_ >> 8;
                auVar141._14_2_ = auVar137._14_2_ >> 8;
                auVar137 = pmaddwd(auVar141,auVar131);
                auVar142._0_4_ = auVar137._0_4_ >> 8;
                auVar142._4_4_ = auVar137._4_4_ >> 8;
                auVar142._8_4_ = auVar137._8_4_ >> 8;
                auVar142._12_4_ = auVar137._12_4_ >> 8;
                auVar137 = packssdw(auVar142,auVar142);
                sVar115 = auVar137._0_2_;
                sVar118 = auVar137._2_2_;
                sVar119 = auVar137._4_2_;
                sVar123 = auVar137._6_2_;
                *puVar102 = CONCAT13((0 < sVar123) * (sVar123 < 0x100) * auVar137[6] -
                                     (0xff < sVar123),
                                     CONCAT12((0 < sVar119) * (sVar119 < 0x100) * auVar137[4] -
                                              (0xff < sVar119),
                                              CONCAT11((0 < sVar118) * (sVar118 < 0x100) *
                                                       auVar137[2] - (0xff < sVar118),
                                                       (0 < sVar115) * (sVar115 < 0x100) *
                                                       auVar137[0] - (0xff < sVar115))));
                local_3c = local_3c + uVar103;
                puVar102 = puVar102 + 1;
              } while (puVar102 < puVar1);
            }
            goto LAB_00668dbb;
          }
          uVar105 = length + 1U >> 1;
          if (length < 0x400) {
            uVar105 = length;
          }
          (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_0)
                    (buffer,buffer + (int)uVar105,&data->field_23,&local_3c,&local_40,uVar103,0);
          puVar102 = buffer + (int)uVar105;
          if (uVar105 == length) goto LAB_00668dbb;
        }
        (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_0)
                  (puVar102,puVar1,&data->field_23,&local_3c,&local_40,uVar103,0);
        goto LAB_00668dbb;
      }
    }
  }
  if (0 < length) {
    dVar143 = data->m11;
    dVar120 = data->m12;
    dVar117 = data->m13;
    dVar132 = data->m23 * dVar146 + dVar144 * dVar117 + data->m33;
    dVar116 = data->dx + data->m21 * dVar146 + dVar144 * dVar143;
    dVar144 = data->dy + data->m22 * dVar146 + dVar144 * dVar120;
    puVar6 = (data->field_23).texture.imageData;
    lVar106 = (data->field_23).texture.bytesPerLine;
    puVar102 = buffer;
    do {
      dVar146 = (double)(-(ulong)(dVar132 == 0.0) & 0x3ff0000000000000 |
                        ~-(ulong)(dVar132 == 0.0) & (ulong)(1.0 / dVar132));
      dVar125 = dVar146 * dVar116 + -0.5;
      dVar146 = dVar146 * dVar144 + -0.5;
      iVar97 = (data->field_23).texture.x1;
      iVar109 = (data->field_23).texture.y1;
      iVar113 = (int)dVar125 - (uint)(dVar125 < 0.0);
      iVar112 = (int)dVar146 - (uint)(dVar146 < 0.0);
      uVar2 = *(undefined8 *)((long)&data->field_23 + 0x18);
      iVar155 = (int)uVar2 + -1;
      iVar111 = (int)((ulong)uVar2 >> 0x20) + -1;
      auVar156._0_4_ = -(uint)(iVar113 < iVar155);
      auVar156._4_4_ = auVar156._0_4_;
      auVar156._8_4_ = -(uint)(iVar112 < iVar111);
      auVar156._12_4_ = -(uint)(iVar112 < iVar111);
      unaff_EBP = movmskpd(unaff_EBP,auVar156);
      iVar98 = iVar155;
      if (iVar113 < iVar155) {
        iVar98 = iVar113;
      }
      iVar107 = iVar113 + 1;
      if ((unaff_EBP & 1) == 0) {
        iVar107 = iVar155;
      }
      if (iVar113 < iVar97) {
        iVar107 = iVar97;
        iVar98 = iVar97;
      }
      iVar97 = iVar111;
      if (iVar112 < iVar111) {
        iVar97 = iVar112;
      }
      if ((unaff_EBP & 2) != 0) {
        iVar111 = iVar112 + 1;
      }
      if (iVar112 < iVar109) {
        iVar111 = iVar109;
        iVar97 = iVar109;
      }
      iVar109 = (int)((dVar125 - (double)iVar113) * 256.0);
      uVar103 = (uint)((dVar146 - (double)iVar112) * 256.0);
      lVar100 = iVar97 * lVar106;
      lVar104 = iVar111 * lVar106;
      uVar145 = *(undefined4 *)(puVar6 + (long)iVar107 * 4 + lVar100);
      uVar3 = *(undefined4 *)(puVar6 + (long)iVar98 * 4 + lVar100);
      uVar4 = *(undefined4 *)(puVar6 + (long)iVar107 * 4 + lVar104);
      uVar5 = *(undefined4 *)(puVar6 + (long)iVar98 * 4 + lVar104);
      uVar114 = CONCAT44(uVar145,uVar3);
      uVar126 = CONCAT44(uVar4,uVar5);
      bVar124 = (byte)((uint)uVar145 >> 0x18);
      auVar37._8_6_ = 0;
      auVar37._0_8_ = uVar114;
      auVar37[0xe] = bVar124;
      auVar41._8_4_ = 0;
      auVar41._0_8_ = uVar114;
      auVar41[0xc] = (char)((uint)uVar145 >> 0x10);
      auVar41._13_2_ = auVar37._13_2_;
      auVar45._8_4_ = 0;
      auVar45._0_8_ = uVar114;
      auVar45._12_3_ = auVar41._12_3_;
      auVar49._8_2_ = 0;
      auVar49._0_8_ = uVar114;
      auVar49[10] = (char)((uint)uVar145 >> 8);
      auVar49._11_4_ = auVar45._11_4_;
      auVar53._8_2_ = 0;
      auVar53._0_8_ = uVar114;
      auVar53._10_5_ = auVar49._10_5_;
      auVar57[8] = (char)uVar145;
      auVar57._0_8_ = uVar114;
      auVar57._9_6_ = auVar53._9_6_;
      auVar71._7_8_ = 0;
      auVar71._0_7_ = auVar57._8_7_;
      Var64 = CONCAT81(SUB158(auVar71 << 0x40,7),(char)((uint)uVar3 >> 0x18));
      auVar89._9_6_ = 0;
      auVar89._0_9_ = Var64;
      auVar61[4] = (char)((uint)uVar3 >> 0x10);
      auVar61._0_4_ = uVar3;
      auVar61._5_10_ = SUB1510(auVar89 << 0x30,5);
      auVar72._11_4_ = 0;
      auVar72._0_11_ = auVar61._4_11_;
      auVar73._1_12_ = SUB1512(auVar72 << 0x20,3);
      auVar73[0] = (char)((uint)uVar3 >> 8);
      auVar129 = pshuflw(ZEXT416(0x100 - uVar103),ZEXT416(0x100 - uVar103),0);
      bVar128 = (byte)((uint)uVar4 >> 0x18);
      auVar38._8_6_ = 0;
      auVar38._0_8_ = uVar126;
      auVar38[0xe] = bVar128;
      auVar42._8_4_ = 0;
      auVar42._0_8_ = uVar126;
      auVar42[0xc] = (char)((uint)uVar4 >> 0x10);
      auVar42._13_2_ = auVar38._13_2_;
      auVar46._8_4_ = 0;
      auVar46._0_8_ = uVar126;
      auVar46._12_3_ = auVar42._12_3_;
      auVar50._8_2_ = 0;
      auVar50._0_8_ = uVar126;
      auVar50[10] = (char)((uint)uVar4 >> 8);
      auVar50._11_4_ = auVar46._11_4_;
      auVar54._8_2_ = 0;
      auVar54._0_8_ = uVar126;
      auVar54._10_5_ = auVar50._10_5_;
      auVar58[8] = (char)uVar4;
      auVar58._0_8_ = uVar126;
      auVar58._9_6_ = auVar54._9_6_;
      auVar74._7_8_ = 0;
      auVar74._0_7_ = auVar58._8_7_;
      Var68 = CONCAT81(SUB158(auVar74 << 0x40,7),(char)((uint)uVar5 >> 0x18));
      auVar90._9_6_ = 0;
      auVar90._0_9_ = Var68;
      auVar62[4] = (char)((uint)uVar5 >> 0x10);
      auVar62._0_4_ = uVar5;
      auVar62._5_10_ = SUB1510(auVar90 << 0x30,5);
      auVar75._11_4_ = 0;
      auVar75._0_11_ = auVar62._4_11_;
      auVar76._1_12_ = SUB1512(auVar75 << 0x20,3);
      auVar76[0] = (char)((uint)uVar5 >> 8);
      auVar134 = pshuflw(ZEXT416(uVar103),ZEXT416(uVar103),0);
      sVar115 = auVar129._0_2_;
      sVar118 = auVar129._2_2_;
      sVar119 = auVar134._0_2_;
      sVar123 = auVar134._2_2_;
      uVar145 = CONCAT22(sVar123 * auVar76._0_2_ + sVar118 * auVar73._0_2_,
                         sVar119 * (ushort)(byte)uVar5 + sVar115 * (ushort)(byte)uVar3);
      auVar153._0_8_ =
           CONCAT26(sVar123 * (short)Var68 + sVar118 * (short)Var64,
                    CONCAT24(sVar119 * auVar62._4_2_ + sVar115 * auVar61._4_2_,uVar145));
      auVar153._8_2_ = sVar119 * auVar58._8_2_ + sVar115 * auVar57._8_2_;
      auVar153._10_2_ = sVar123 * auVar50._10_2_ + sVar118 * auVar49._10_2_;
      auVar154._12_2_ = sVar119 * auVar42._12_2_ + sVar115 * auVar41._12_2_;
      auVar154._0_12_ = auVar153;
      auVar154._14_2_ = sVar123 * (ushort)bVar128 + sVar118 * (ushort)bVar124;
      auVar149._0_4_ = CONCAT22((short)iVar109,(short)(0x100 - iVar109));
      auVar149._4_4_ = auVar149._0_4_;
      auVar149._8_4_ = auVar149._0_4_;
      auVar149._12_4_ = auVar149._0_4_;
      auVar150._4_4_ = auVar153._8_4_;
      auVar150._0_4_ = uVar145;
      auVar150._8_4_ = (int)((ulong)auVar153._0_8_ >> 0x20);
      auVar150._12_4_ = auVar154._12_4_;
      auVar129 = pshuflw(auVar150,auVar150,0xd8);
      auVar129 = pshufhw(auVar129,auVar129,0xd8);
      auVar151._0_2_ = auVar129._0_2_ >> 8;
      auVar151._2_2_ = auVar129._2_2_ >> 8;
      auVar151._4_2_ = auVar129._4_2_ >> 8;
      auVar151._6_2_ = auVar129._6_2_ >> 8;
      auVar151._8_2_ = auVar129._8_2_ >> 8;
      auVar151._10_2_ = auVar129._10_2_ >> 8;
      auVar151._12_2_ = auVar129._12_2_ >> 8;
      auVar151._14_2_ = auVar129._14_2_ >> 8;
      auVar129 = pmaddwd(auVar151,auVar149);
      auVar152._0_4_ = auVar129._0_4_ >> 8;
      auVar152._4_4_ = auVar129._4_4_ >> 8;
      auVar152._8_4_ = auVar129._8_4_ >> 8;
      auVar152._12_4_ = auVar129._12_4_ >> 8;
      dVar116 = dVar116 + dVar143;
      dVar144 = dVar144 + dVar120;
      auVar129 = packssdw(auVar152,auVar152);
      dVar132 = dVar132 + dVar117;
      sVar115 = auVar129._0_2_;
      sVar118 = auVar129._2_2_;
      sVar119 = auVar129._4_2_;
      sVar123 = auVar129._6_2_;
      *puVar102 = CONCAT13((0 < sVar123) * (sVar123 < 0x100) * auVar129[6] - (0xff < sVar123),
                           CONCAT12((0 < sVar119) * (sVar119 < 0x100) * auVar129[4] -
                                    (0xff < sVar119),
                                    CONCAT11((0 < sVar118) * (sVar118 < 0x100) * auVar129[2] -
                                             (0xff < sVar118),
                                             (0 < sVar115) * (sVar115 < 0x100) * auVar129[0] -
                                             (0xff < sVar115))));
      dVar132 = (double)((ulong)dVar132 & -(ulong)(dVar132 != 0.0) |
                        ~-(ulong)(dVar132 != 0.0) & (ulong)(dVar117 + dVar132));
      puVar102 = puVar102 + 1;
    } while (puVar102 < puVar1);
  }
LAB_00668dbb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return buffer;
  }
  __stack_chk_fail();
}

Assistant:

static const uint * QT_FASTCALL fetchTransformedBilinearARGB32PM(uint *buffer, const Operator *,
                                                                 const QSpanData *data, int y, int x,
                                                                 int length)
{
    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);
    constexpr int tiled = (blendType == BlendTransformedBilinearTiled) ? 1 : 0;

    uint *end = buffer + length;
    uint *b = buffer;
    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) {
                // simple scale up on X
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) {
                // simple scale down on X, less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(data->m22) < qreal(1./8.)) {
                // scale up more than 8x (on Y)
                bilinearFastTransformHelperARGB32PM[tiled][UpscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // scale down on X
                bilinearFastTransformHelperARGB32PM[tiled][DownscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        } else { // rotation or shear
            if (qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.) ) {
                // if we are zooming more than 8 times, we use 8bit precision for the position.
                bilinearFastTransformHelperARGB32PM[tiled][RotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // we are zooming less than 8x, use 4bit precision
                bilinearFastTransformHelperARGB32PM[tiled][FastRotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        }
    } else {
        const QTextureData &image = data->texture;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal px = fx * iw - qreal(0.5);
            const qreal py = fy * iw - qreal(0.5);

            int x1 = int(px) - (px < 0);
            int x2;
            int y1 = int(py) - (py < 0);
            int y2;

            int distx = int((px - x1) * 256);
            int disty = int((py - y1) * 256);

            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

            const uint *s1 = (const uint *)data->texture.scanLine(y1);
            const uint *s2 = (const uint *)data->texture.scanLine(y2);

            uint tl = s1[x1];
            uint tr = s1[x2];
            uint bl = s2[x1];
            uint br = s2[x2];

            *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }

    return buffer;
}